

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaCheckCVCWildcardNamespace(xmlSchemaWildcardPtr wild,xmlChar *ns)

{
  int iVar1;
  _xmlSchemaWildcardNs *p_Var2;
  
  if (wild == (xmlSchemaWildcardPtr)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = 0;
    if (wild->any == 0) {
      p_Var2 = wild->nsSet;
      if (p_Var2 == (xmlSchemaWildcardNsPtr)0x0) {
        if ((ns != (xmlChar *)0x0 && wild->negNsSet != (xmlSchemaWildcardNsPtr)0x0) &&
           (iVar1 = xmlStrEqual(wild->negNsSet->value,ns), iVar1 == 0)) {
          return 0;
        }
      }
      else {
        iVar1 = xmlStrEqual(p_Var2->value,ns);
        if (iVar1 != 0) {
          return 0;
        }
        do {
          p_Var2 = p_Var2->next;
          if (p_Var2 == (_xmlSchemaWildcardNs *)0x0) goto LAB_001a5b74;
          iVar1 = xmlStrEqual(p_Var2->value,ns);
        } while (iVar1 == 0);
        if (p_Var2 != (_xmlSchemaWildcardNs *)0x0) {
          return 0;
        }
      }
LAB_001a5b74:
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

static int
xmlSchemaCheckCVCWildcardNamespace(xmlSchemaWildcardPtr wild,
				   const xmlChar* ns)
{
    if (wild == NULL)
	return(-1);

    if (wild->any)
	return(0);
    else if (wild->nsSet != NULL) {
	xmlSchemaWildcardNsPtr cur;

	cur = wild->nsSet;
	while (cur != NULL) {
	    if (xmlStrEqual(cur->value, ns))
		return(0);
	    cur = cur->next;
	}
    } else if ((wild->negNsSet != NULL) && (ns != NULL) &&
	(!xmlStrEqual(wild->negNsSet->value, ns)))
	return(0);

    return(1);
}